

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_corrupt_utf8(void)

{
  char cVar1;
  int __fd;
  void *__buf;
  ssize_t sVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_t b;
  undefined1 auStack_180 [368];
  
  __buf = (void *)bson_malloc0(0x400);
  __fd = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test56.bson"
              ,0);
  if (__fd == -1) {
    pcVar5 = "-1 != fd";
    uVar4 = 0x2d4;
  }
  else {
    sVar2 = read(__fd,__buf,0x400);
    if (sVar2 == 0x2a) {
      cVar1 = bson_init_static(auStack_180,__buf,0x2a);
      if (cVar1 == '\0') {
        pcVar5 = "r";
        uVar4 = 0x2da;
      }
      else {
        lVar3 = bson_as_json(auStack_180,0);
        if (lVar3 == 0) {
          bson_destroy(auStack_180);
          bson_free(__buf);
          return;
        }
        pcVar5 = "!str";
        uVar4 = 0x2dd;
      }
    }
    else {
      pcVar5 = "r == 42";
      uVar4 = 0x2d7;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar4,"test_bson_corrupt_utf8",pcVar5);
  abort();
}

Assistant:

static void
test_bson_corrupt_utf8 (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/test56.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 42);

   r = bson_init_static (&b, buf, (uint32_t) r);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (!str);

   bson_destroy (&b);
   bson_free (buf);
}